

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Aig_Man_t * Aig_ManDupPartAll(Aig_Man_t *pOld,Vec_Int_t *vPart)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_34;
  int Entry;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Int_t *vPart_local;
  Aig_Man_t *pOld_local;
  
  Aig_ManIncrementTravId(pOld);
  p = Aig_ManStart(5000);
  pAVar2 = Aig_ManConst1(pOld);
  pAVar3 = Aig_ManConst1(p);
  (pAVar2->field_5).pData = pAVar3;
  (pAVar3->field_5).pData = pAVar2;
  Aig_ObjSetTravIdCurrent(pOld,pAVar2);
  for (local_34 = 0; iVar1 = Vec_IntSize(vPart), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vPart,local_34);
    pAVar2 = Aig_ManCo(pOld,iVar1);
    Aig_ManDupPartAll_rec(p,pOld,pAVar2);
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManDupPartAll( Aig_Man_t * pOld, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Entry;
    Aig_ManIncrementTravId( pOld );
    pNew = Aig_ManStart( 5000 );
    // map constant nodes
    pObj = Aig_ManConst1(pOld);
    pObjNew = Aig_ManConst1(pNew);
    pObj->pData = pObjNew;
    pObjNew->pData = pObj;
    Aig_ObjSetTravIdCurrent(pOld, pObj);
    // map all other nodes
    Vec_IntForEachEntry( vPart, Entry, i )
    {
        pObj = Aig_ManCo( pOld, Entry );
        Aig_ManDupPartAll_rec( pNew, pOld, pObj );
    }
    return pNew;
}